

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_gsupport.cpp
# Opt level: O0

void __GOMP_taskloop<unsigned_long_long>
               (_func_void_void_ptr *func,void *data,_func_void_void_ptr_void_ptr *copy_func,
               long arg_size,long arg_align,uint gomp_flags,unsigned_long num_tasks,int priority,
               unsigned_long_long start,unsigned_long_long end,unsigned_long_long step)

{
  undefined8 *puVar1;
  int iVar2;
  kmp_task_t *pkVar3;
  byte bVar4;
  ulong in_RCX;
  kmp_routine_entry_t in_RDX;
  char *unaff_RBX;
  void *in_RSI;
  kmp_routine_entry_t in_RDI;
  ulong in_R8;
  uint in_R9D;
  size_t unaff_R14;
  kmp_tasking_flags_t *unaff_retaddr;
  kmp_int32 in_stack_0000000c;
  ident_t *in_stack_00000010;
  kmp_uint64 *in_stack_00000018;
  undefined4 in_stack_00000020;
  int in_stack_00000024;
  kmp_task_t *in_stack_00000028;
  kmp_taskdata_t *taskdata;
  kmp_task_t *task;
  int i;
  kmp_tasking_flags_t *input_flags;
  p_task_dup_t task_dup;
  int up;
  int nogroup;
  int if_val;
  kmp_int32 flags;
  int gtid;
  unsigned_long_long *loop_bounds;
  int sched;
  int local_74;
  
  __kmp_get_global_thread_id_reg();
  if (in_RCX < 0x10) {
    __kmp_debug_assert(unaff_RBX,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  }
  if ((long)in_R8 < 1) {
    __kmp_debug_assert(unaff_RBX,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  }
  if (((in_R9D & 0x100) == 0) && (in_stack_00000028 != (kmp_task_t *)0x0)) {
    local_74 = 0x3f;
    for (; (-1 < local_74 &&
           (bVar4 = (byte)local_74, ((ulong)in_stack_00000028 & 1L << (bVar4 & 0x3f)) == 0));
        in_stack_00000028 = (kmp_task_t *)(1L << (bVar4 & 0x3f) | (ulong)in_stack_00000028)) {
      local_74 = local_74 + -1;
    }
  }
  pkVar3 = __kmp_task_alloc(in_stack_00000010,in_stack_0000000c,unaff_retaddr,unaff_R14,
                            (size_t)unaff_RBX,in_RDI);
  pkVar3[-4].data1.destructors = in_RDX;
  *(undefined4 *)((long)&pkVar3[-4].routine + 4) = 8;
  pkVar3->shareds = (void *)((((long)pkVar3->shareds + (in_R8 - 1)) / in_R8) * in_R8);
  memcpy(pkVar3->shareds,in_RSI,in_RCX);
  puVar1 = (undefined8 *)pkVar3->shareds;
  *puVar1 = in_stack_00000018;
  iVar2 = 1;
  if ((in_R9D & 0x100) != 0) {
    iVar2 = -1;
  }
  puVar1[1] = CONCAT44(in_stack_00000024,in_stack_00000020) + (long)iVar2;
  __kmpc_taskloop((ident_t *)task,taskdata._4_4_,in_stack_00000028,in_stack_00000024,
                  in_stack_00000018,(kmp_uint64 *)in_stack_00000010,(kmp_int64)loop_bounds,sched,
                  (int)arg_align,arg_size,copy_func);
  return;
}

Assistant:

void __GOMP_taskloop(void (*func)(void *), void *data,
                     void (*copy_func)(void *, void *), long arg_size,
                     long arg_align, unsigned gomp_flags,
                     unsigned long num_tasks, int priority, T start, T end,
                     T step) {
  typedef void (*p_task_dup_t)(kmp_task_t *, kmp_task_t *, kmp_int32);
  MKLOC(loc, "GOMP_taskloop");
  int sched;
  T *loop_bounds;
  int gtid = __kmp_entry_gtid();
  kmp_int32 flags = 0;
  int if_val = gomp_flags & (1u << 10);
  int nogroup = gomp_flags & (1u << 11);
  int up = gomp_flags & (1u << 8);
  p_task_dup_t task_dup = NULL;
  kmp_tasking_flags_t *input_flags = (kmp_tasking_flags_t *)&flags;
#ifdef KMP_DEBUG
  {
    char *buff;
    buff = __kmp_str_format(
        "GOMP_taskloop: T#%%d: func:%%p data:%%p copy_func:%%p "
        "arg_size:%%ld arg_align:%%ld gomp_flags:0x%%x num_tasks:%%lu "
        "priority:%%d start:%%%s end:%%%s step:%%%s\n",
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec);
    KA_TRACE(20, (buff, gtid, func, data, copy_func, arg_size, arg_align,
                  gomp_flags, num_tasks, priority, start, end, step));
    __kmp_str_free(&buff);
  }
#endif
  KMP_ASSERT((size_t)arg_size >= 2 * sizeof(T));
  KMP_ASSERT(arg_align > 0);
  // The low-order bit is the "untied" flag
  if (!(gomp_flags & 1)) {
    input_flags->tiedness = 1;
  }
  // The second low-order bit is the "final" flag
  if (gomp_flags & 2) {
    input_flags->final = 1;
  }
  // Negative step flag
  if (!up) {
    // If step is flagged as negative, but isn't properly sign extended
    // Then manually sign extend it.  Could be a short, int, char embedded
    // in a long.  So cannot assume any cast.
    if (step > 0) {
      for (int i = sizeof(T) * CHAR_BIT - 1; i >= 0L; --i) {
        // break at the first 1 bit
        if (step & ((T)1 << i))
          break;
        step |= ((T)1 << i);
      }
    }
  }
  input_flags->native = 1;
  // Figure out if none/grainsize/num_tasks clause specified
  if (num_tasks > 0) {
    if (gomp_flags & (1u << 9))
      sched = 1; // grainsize specified
    else
      sched = 2; // num_tasks specified
    // neither grainsize nor num_tasks specified
  } else {
    sched = 0;
  }

  // __kmp_task_alloc() sets up all other flags
  kmp_task_t *task =
      __kmp_task_alloc(&loc, gtid, input_flags, sizeof(kmp_task_t),
                       arg_size + arg_align - 1, (kmp_routine_entry_t)func);
  kmp_taskdata_t *taskdata = KMP_TASK_TO_TASKDATA(task);
  taskdata->td_copy_func = copy_func;
  taskdata->td_size_loop_bounds = sizeof(T);

  // re-align shareds if needed and setup firstprivate copy constructors
  // through the task_dup mechanism
  task->shareds = (void *)((((size_t)task->shareds) + arg_align - 1) /
                           arg_align * arg_align);
  if (copy_func) {
    task_dup = __kmp_gomp_task_dup;
  }
  KMP_MEMCPY(task->shareds, data, arg_size);

  loop_bounds = (T *)task->shareds;
  loop_bounds[0] = start;
  loop_bounds[1] = end + (up ? -1 : 1);
  __kmpc_taskloop(&loc, gtid, task, if_val, (kmp_uint64 *)&(loop_bounds[0]),
                  (kmp_uint64 *)&(loop_bounds[1]), (kmp_int64)step, nogroup,
                  sched, (kmp_uint64)num_tasks, (void *)task_dup);
}